

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_decompressBegin(ZSTD_DCtx *dctx)

{
  if (dctx == (ZSTD_DCtx *)0x0) {
    __assert_fail("dctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5e23,"size_t ZSTD_decompressBegin(ZSTD_DCtx *)");
  }
  if (dctx->format < 2) {
    dctx->expected = (ulong)(dctx->format == ZSTD_f_zstd1) * 4 + 1;
    dctx->decodedSize = 0;
    dctx->previousDstEnd = (void *)0x0;
    dctx->prefixStart = (void *)0x0;
    dctx->virtualStart = (void *)0x0;
    dctx->dictEnd = (void *)0x0;
    (dctx->entropy).hufTable[0] = 0xc00000c;
    dctx->litEntropy = 0;
    dctx->fseEntropy = 0;
    dctx->dictID = 0;
    dctx->bType = bt_reserved;
    dctx->stage = ZSTDds_getFrameHeaderSize;
    (dctx->entropy).rep[0] = 1;
    (dctx->entropy).rep[1] = 4;
    (dctx->entropy).rep[2] = 8;
    dctx->LLTptr = (dctx->entropy).LLTable;
    dctx->MLTptr = (dctx->entropy).MLTable;
    dctx->OFTptr = (dctx->entropy).OFTable;
    dctx->HUFptr = (dctx->entropy).hufTable;
    return 0;
  }
  __assert_fail("(format == ZSTD_f_zstd1) || (format == ZSTD_f_zstd1_magicless)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x5a00,"size_t ZSTD_startingInputLength(ZSTD_format_e)");
}

Assistant:

size_t ZSTD_decompressBegin(ZSTD_DCtx* dctx)
{
    assert(dctx != NULL);
    dctx->expected = ZSTD_startingInputLength(dctx->format);  /* dctx->format must be properly set */
    dctx->stage = ZSTDds_getFrameHeaderSize;
    dctx->decodedSize = 0;
    dctx->previousDstEnd = NULL;
    dctx->prefixStart = NULL;
    dctx->virtualStart = NULL;
    dctx->dictEnd = NULL;
    dctx->entropy.hufTable[0] = (HUF_DTable)((HufLog)*0x1000001);  /* cover both little and big endian */
    dctx->litEntropy = dctx->fseEntropy = 0;
    dctx->dictID = 0;
    dctx->bType = bt_reserved;
    ZSTD_STATIC_ASSERT(sizeof(dctx->entropy.rep) == sizeof(repStartValue));
    memcpy(dctx->entropy.rep, repStartValue, sizeof(repStartValue));  /* initial repcodes */
    dctx->LLTptr = dctx->entropy.LLTable;
    dctx->MLTptr = dctx->entropy.MLTable;
    dctx->OFTptr = dctx->entropy.OFTable;
    dctx->HUFptr = dctx->entropy.hufTable;
    return 0;
}